

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
::insert_multi<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>
          (btree<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
           *this,key_type *key,pair<const_S2CellId,_S2PointIndex<int>::PointData> *v)

{
  bool bVar1;
  node_type **ppnVar2;
  node_type *pnVar3;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
  bVar4;
  iterator iVar5;
  iterator iVar6;
  undefined1 local_50 [12];
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbStack_40;
  iterator iter;
  pair<const_S2CellId,_S2PointIndex<int>::PointData> *v_local;
  key_type *key_local;
  btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *this_local;
  
  iter._8_8_ = v;
  bVar1 = btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          ::empty((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *)this);
  if (bVar1) {
    pnVar3 = btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
             ::new_leaf_root_node
                       ((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar3;
    ppnVar2 = btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              ::mutable_root((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                              *)this);
    *ppnVar2 = pnVar3;
  }
  pnVar3 = btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           ::root((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *)this);
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
  ::btree_iterator((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
                    *)local_50,pnVar3,0);
  bVar4._12_4_ = 0;
  bVar4.node = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                *)local_50._0_8_;
  bVar4.position = local_50._8_4_;
  bVar4 = internal_upper_bound<S2CellId,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>,std::pair<S2CellId_const,S2PointIndex<int>::PointData>&,std::pair<S2CellId_const,S2PointIndex<int>::PointData>*>>
                    (this,key,bVar4);
  pbStack_40 = bVar4.node;
  iter.node._0_4_ = bVar4.position;
  if (pbStack_40 ==
      (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
       *)0x0) {
    iVar5 = btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
            ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *)this);
    pbStack_40 = iVar5.node;
    iter.node._0_4_ = iVar5.position;
  }
  iVar5.position = (int)iter.node;
  iVar5.node = pbStack_40;
  iVar5._12_4_ = 0;
  iVar5 = internal_emplace<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>
                    (this,iVar5,(pair<const_S2CellId,_S2PointIndex<int>::PointData> *)iter._8_8_);
  iVar6._12_4_ = 0;
  iVar6.node = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                *)SUB128(iVar5._0_12_,0);
  iVar6.position = SUB124(iVar5._0_12_,8);
  return iVar6;
}

Assistant:

auto btree<P>::insert_multi(const key_type &key, ValueType &&v) -> iterator {
  if (empty()) {
    mutable_root() = rightmost_ = new_leaf_root_node(1);
  }

  iterator iter = internal_upper_bound(key, iterator(root(), 0));
  if (!iter.node) {
    iter = end();
  }
  return internal_emplace(iter, std::forward<ValueType>(v));
}